

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

void ImGui::TableOpenContextMenu(int column_n)

{
  ImGuiTable *pIVar1;
  int in_EDI;
  ImGuiID context_menu_id;
  ImGuiTable *table;
  ImGuiContext *g;
  ImGuiPopupFlags in_stack_00000030;
  ImGuiID in_stack_00000034;
  int local_4;
  
  pIVar1 = GImGui->CurrentTable;
  local_4 = in_EDI;
  if ((in_EDI == -1) && (pIVar1->CurrentColumn != -1)) {
    local_4 = pIVar1->CurrentColumn;
  }
  if (local_4 == pIVar1->ColumnsCount) {
    local_4 = -1;
  }
  if ((pIVar1->Flags & 7U) != 0) {
    pIVar1->IsContextPopupOpen = true;
    pIVar1->ContextPopupColumn = (ImGuiTableColumnIdx)local_4;
    pIVar1->InstanceInteracted = pIVar1->InstanceCurrent;
    ImHashStr("##ContextMenu",0,pIVar1->ID);
    OpenPopupEx(in_stack_00000034,in_stack_00000030);
  }
  return;
}

Assistant:

void ImGui::TableOpenContextMenu(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (column_n == -1 && table->CurrentColumn != -1)   // When called within a column automatically use this one (for consistency)
        column_n = table->CurrentColumn;
    if (column_n == table->ColumnsCount)                // To facilitate using with TableGetHoveredColumn()
        column_n = -1;
    IM_ASSERT(column_n >= -1 && column_n < table->ColumnsCount);
    if (table->Flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Hideable))
    {
        table->IsContextPopupOpen = true;
        table->ContextPopupColumn = (ImGuiTableColumnIdx)column_n;
        table->InstanceInteracted = table->InstanceCurrent;
        const ImGuiID context_menu_id = ImHashStr("##ContextMenu", 0, table->ID);
        OpenPopupEx(context_menu_id, ImGuiPopupFlags_None);
    }
}